

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::stack
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  stack<c4::yml::Parser::State,_16UL> *in_stack_000000d8;
  stack<c4::yml::Parser::State,_16UL> *in_stack_000000e0;
  
  stack(this,(Callbacks *)that);
  _mv(in_stack_000000e0,in_stack_000000d8);
  return;
}

Assistant:

stack(stack &&that) noexcept : stack(that.m_callbacks)
    {
        _mv(&that);
    }